

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n2builder.cpp
# Opt level: O2

void __thiscall
icu_63::Normalizer2DataBuilder::setRoundTripMapping
          (Normalizer2DataBuilder *this,UChar32 c,UnicodeString *m)

{
  short sVar1;
  UBool UVar2;
  uint uVar3;
  char16_t *s;
  Norm *p;
  UnicodeString *this_00;
  ulong uVar4;
  int32_t length;
  Norm *size;
  char *__format;
  
  uVar4 = (ulong)(uint)c;
  if ((c & 0xfffff800U) == 0xd800) {
    uVar3 = this->phase;
    __format = 
    "error in gennorm2 phase %d: illegal round-trip mapping from surrogate code point U+%04lX\n";
  }
  else {
    UVar2 = isWellFormed(m);
    if (UVar2 != '\0') {
      s = UnicodeString::getBuffer(m);
      sVar1 = (m->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        length = (m->fUnion).fFields.fLength;
      }
      else {
        length = (int)sVar1 >> 5;
      }
      uVar3 = u_countChar32_63(s,length);
      if (uVar3 == 2) {
        p = Norms::createNorm(&this->norms,c);
        size = p;
        checkNormForMapping(this,p,c);
        this_00 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)size);
        if (this_00 != (UnicodeString *)0x0) {
          UnicodeString::UnicodeString(this_00,m);
        }
        p->mapping = this_00;
        p->mappingType = ROUND_TRIP;
        p->mappingCP = -1;
        UnicodeSet::add(&(this->norms).mappingSet,c);
        return;
      }
      fprintf(_stderr,
              "error in gennorm2 phase %d: illegal round-trip mapping from U+%04lX to %d!=2 code points\n"
              ,(ulong)(uint)this->phase,(long)c,(ulong)uVar3);
      goto LAB_001e77cc;
    }
    uVar3 = this->phase;
    uVar4 = (ulong)c;
    __format = 
    "error in gennorm2 phase %d: illegal round-trip mapping from U+%04lX to malformed string\n";
  }
  fprintf(_stderr,__format,(ulong)uVar3,uVar4);
LAB_001e77cc:
  exit(3);
}

Assistant:

void Normalizer2DataBuilder::setRoundTripMapping(UChar32 c, const UnicodeString &m) {
    if(U_IS_SURROGATE(c)) {
        fprintf(stderr,
                "error in gennorm2 phase %d: "
                "illegal round-trip mapping from surrogate code point U+%04lX\n",
                (int)phase, (long)c);
        exit(U_INVALID_FORMAT_ERROR);
    }
    if(!isWellFormed(m)) {
        fprintf(stderr,
                "error in gennorm2 phase %d: "
                "illegal round-trip mapping from U+%04lX to malformed string\n",
                (int)phase, (long)c);
        exit(U_INVALID_FORMAT_ERROR);
    }
    int32_t numCP=u_countChar32(toUCharPtr(m.getBuffer()), m.length());
    if(numCP!=2) {
        fprintf(stderr,
                "error in gennorm2 phase %d: "
                "illegal round-trip mapping from U+%04lX to %d!=2 code points\n",
                (int)phase, (long)c, (int)numCP);
        exit(U_INVALID_FORMAT_ERROR);
    }
    Norm *p=checkNormForMapping(norms.createNorm(c), c);
    p->mapping=new UnicodeString(m);
    p->mappingType=Norm::ROUND_TRIP;
    p->mappingCP=U_SENTINEL;
    norms.mappingSet.add(c);
}